

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303DLHC.cpp
# Opt level: O1

bool __thiscall RTIMUGD20HM303DLHC::setCompassCRB(RTIMUGD20HM303DLHC *this)

{
  RTFLOAT RVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  uint uVar3;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar3 = this_00->m_GD20HM303DLHCCompassFsr - 1;
  if (uVar3 < 7) {
    RVar1 = *(RTFLOAT *)(&DAT_00123488 + (ulong)uVar3 * 4);
    this->m_compassScaleXY = *(RTFLOAT *)(&DAT_0012346c + (ulong)uVar3 * 4);
    this->m_compassScaleZ = RVar1;
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_compassSlaveAddr,'\x01',
                               (char)uVar3 * ' ' + ' ',"Failed to set LSM303DLHC CRB_M");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM303DLHC compass FSR code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20HM303DLHC::setCompassCRB()
{
    unsigned char crb;

    //  convert FSR to uT

    switch (m_settings->m_GD20HM303DLHCCompassFsr) {
    case LSM303DLHC_COMPASS_FSR_1_3:
        crb = 0x20;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)1100;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)980;
        break;

    case LSM303DLHC_COMPASS_FSR_1_9:
        crb = 0x40;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)855;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)760;
       break;

    case LSM303DLHC_COMPASS_FSR_2_5:
        crb = 0x60;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)670;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)600;
        break;

    case LSM303DLHC_COMPASS_FSR_4:
        crb = 0x80;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)450;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)400;
        break;

    case LSM303DLHC_COMPASS_FSR_4_7:
        crb = 0xa0;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)400;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)355;
        break;

    case LSM303DLHC_COMPASS_FSR_5_6:
        crb = 0xc0;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)330;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)295;
        break;

    case LSM303DLHC_COMPASS_FSR_8_1:
        crb = 0xe0;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)230;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)205;
        break;

    default:
        HAL_ERROR1("Illegal LSM303DLHC compass FSR code %d\n", m_settings->m_GD20HM303DLHCCompassFsr);
        return false;
    }

    return m_settings->HALWrite(m_compassSlaveAddr,  LSM303DLHC_CRB_M, crb, "Failed to set LSM303DLHC CRB_M");
}